

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

uint md_link_label_hash(MD_CHAR *label,MD_SIZE size)

{
  uint codepoint_00;
  int iVar1;
  uint in_ESI;
  MD_UNICODE_FOLD_INFO *in_RDI;
  long in_FS_OFFSET;
  int is_whitespace;
  MD_OFFSET off;
  uint hash;
  MD_SIZE char_size;
  uint codepoint;
  MD_UNICODE_FOLD_INFO fold_info;
  MD_SIZE in_stack_ffffffffffffffb8;
  MD_OFFSET in_stack_ffffffffffffffbc;
  uint in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc4;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  uint local_34;
  uint local_30;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = 0x811c9dc5;
  local_34 = md_skip_unicode_whitespace
                       ((MD_CHAR *)
                        CONCAT17(in_stack_ffffffffffffffc7,
                                 CONCAT16(in_stack_ffffffffffffffc6,
                                          CONCAT24(in_stack_ffffffffffffffc4,
                                                   in_stack_ffffffffffffffc0))),
                        in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  while (local_34 < in_ESI) {
    codepoint_00 = md_decode_unicode((MD_CHAR *)
                                     CONCAT17(in_stack_ffffffffffffffc7,
                                              CONCAT16(in_stack_ffffffffffffffc6,
                                                       CONCAT24(in_stack_ffffffffffffffc4,
                                                                in_stack_ffffffffffffffc0))),
                                     in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                                     (MD_SIZE *)0xa0c74c);
    iVar1 = md_is_unicode_whitespace__(in_stack_ffffffffffffffc0);
    in_stack_ffffffffffffffc7 = true;
    if ((iVar1 == 0) &&
       (in_stack_ffffffffffffffc6 = true, in_stack_ffffffffffffffc7 = in_stack_ffffffffffffffc6,
       *(char *)((long)in_RDI->codepoints + (ulong)local_34) != '\r')) {
      in_stack_ffffffffffffffc6 = *(char *)((long)in_RDI->codepoints + (ulong)local_34) == '\n';
      in_stack_ffffffffffffffc7 = in_stack_ffffffffffffffc6;
    }
    if ((bool)in_stack_ffffffffffffffc7 == false) {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      md_get_unicode_fold_info(codepoint_00,in_RDI);
      local_30 = md_fnv1a(local_30,&local_18,((ulong)local_10 >> 0x20) << 2);
      local_34 = local_34 + 0xaaaaaaaa;
    }
    else {
      local_30 = md_fnv1a(local_30,&stack0xffffffffffffffe4,4);
      local_34 = md_skip_unicode_whitespace
                           ((MD_CHAR *)
                            CONCAT17(in_stack_ffffffffffffffc7,
                                     CONCAT16(in_stack_ffffffffffffffc6,
                                              CONCAT24(in_stack_ffffffffffffffc4,
                                                       in_stack_ffffffffffffffc0))),
                            in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

static unsigned
md_link_label_hash(const CHAR* label, SZ size)
{
    unsigned hash = MD_FNV1A_BASE;
    OFF off;
    unsigned codepoint;
    int is_whitespace = FALSE;

    off = md_skip_unicode_whitespace(label, 0, size);
    while(off < size) {
        SZ char_size;

        codepoint = md_decode_unicode(label, off, size, &char_size);
        is_whitespace = ISUNICODEWHITESPACE_(codepoint) || ISNEWLINE_(label[off]);

        if(is_whitespace) {
            codepoint = ' ';
            hash = md_fnv1a(hash, &codepoint, sizeof(unsigned));
            off = md_skip_unicode_whitespace(label, off, size);
        } else {
            MD_UNICODE_FOLD_INFO fold_info;

            md_get_unicode_fold_info(codepoint, &fold_info);
            hash = md_fnv1a(hash, fold_info.codepoints, fold_info.n_codepoints * sizeof(unsigned));
            off += char_size;
        }
    }

    return hash;
}